

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::setupPupdate(SPxSolverBase<double> *this)

{
  SSVectorBase<double> *x;
  UpdateVector<double> *pUVar1;
  SSVectorBase<double> *this_00;
  
  pUVar1 = this->theCoPvec;
  this_00 = &this->thePvec->thedelta;
  x = &pUVar1->thedelta;
  if ((pUVar1->thedelta).setupStatus == true) {
    if ((double)(int)((ulong)((long)(pUVar1->super_VectorBase<double>).val.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(pUVar1->super_VectorBase<double>).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 3) * 0.95 <=
        (double)(pUVar1->thedelta).super_IdxSet.num) {
      (*this->multTimeColwise->_vptr_Timer[3])();
      SSVectorBase<double>::assign2product<double,double>(this_00,x,this->thevectors);
      (*this->multTimeColwise->_vptr_Timer[4])();
      this->multColwiseCalls = this->multColwiseCalls + 1;
    }
    else {
      SSVectorBase<double>::assign2product4setup<double,double>
                (this_00,this->thecovectors,x,this->multTimeSparse,this->multTimeFull,
                 &this->multSparseCalls,&this->multFullCalls);
    }
  }
  else {
    (*this->multTimeUnsetup->_vptr_Timer[3])();
    SSVectorBase<double>::assign2productAndSetup<double,double>(this_00,this->thecovectors,x);
    (*this->multTimeUnsetup->_vptr_Timer[4])();
    this->multUnsetupCalls = this->multUnsetupCalls + 1;
  }
  SSVectorBase<double>::setup(this_00);
  return;
}

Assistant:

void SPxSolverBase<R>::setupPupdate(void)
{
   SSVectorBase<R>& p = thePvec->delta();
   SSVectorBase<R>& c = theCoPvec->delta();

   if(c.isSetup())
   {
      if(c.size() < 0.95 * theCoPvec->dim())
         p.assign2product4setup(*thecovectors, c,
                                multTimeSparse, multTimeFull,
                                multSparseCalls, multFullCalls);
      else
      {
         multTimeColwise->start();
         p.assign2product(c, *thevectors);
         multTimeColwise->stop();
         ++multColwiseCalls;
      }
   }
   else
   {
      multTimeUnsetup->start();
      p.assign2productAndSetup(*thecovectors, c);
      multTimeUnsetup->stop();
      ++multUnsetupCalls;
   }

   p.setup();
}